

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::IsAnyMouseDown(void)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  
  bVar3 = true;
  if ((GImGui->IO).MouseDown[0] == false) {
    uVar1 = 0;
    do {
      uVar2 = uVar1;
      if (uVar2 == 4) break;
      uVar1 = uVar2 + 1;
    } while ((GImGui->IO).MouseDown[uVar2 + 1] != true);
    bVar3 = uVar2 < 4;
  }
  return bVar3;
}

Assistant:

bool ImGui::IsAnyMouseDown()
{
    ImGuiContext& g = *GImGui;
    for (int n = 0; n < IM_ARRAYSIZE(g.IO.MouseDown); n++)
        if (g.IO.MouseDown[n])
            return true;
    return false;
}